

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O3

bool __thiscall
UnifiedRegex::BeginLoopIfCharInst::Exec
          (BeginLoopIfCharInst *this,Matcher *matcher,Char *input,CharCount inputLength,
          CharCount *matchStart,CharCount *inputOffset,CharCount *nextSyncInputOffset,
          uint8 **instPointer,ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,
          bool firstIteration)

{
  uint64 *puVar1;
  int iVar2;
  LoopInfo *pLVar3;
  code *pcVar4;
  bool bVar5;
  undefined4 *puVar6;
  Program *pPVar7;
  uint uVar8;
  
  if (matcher->stats != (Type)0x0) {
    puVar1 = &matcher->stats->numCompares;
    *puVar1 = *puVar1 + 1;
  }
  if ((*inputOffset < inputLength) && (input[*inputOffset] == (this->super_CharMixin).c)) {
    iVar2 = (this->super_BeginLoopMixin).super_BeginLoopBasicsMixin.loopId;
    if (((long)iVar2 < 0) || (((matcher->program).ptr)->numLoops <= iVar2)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                         ,0x77b,"(loopId >= 0 && loopId < program->numLoops)",
                         "loopId >= 0 && loopId < program->numLoops");
      if (!bVar5) {
LAB_00ef8077:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar6 = 0;
    }
    pLVar3 = (matcher->loopInfos).ptr;
    uVar8 = (this->super_BodyGroupsMixin).minBodyGroupId;
    if ((int)uVar8 <= (this->super_BodyGroupsMixin).maxBodyGroupId) {
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      do {
        if (((int)uVar8 < 0) || (((matcher->program).ptr)->numGroups <= uVar8)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar6 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                             ,0x782,"(groupId >= 0 && groupId < program->numGroups)",
                             "groupId >= 0 && groupId < program->numGroups");
          if (!bVar5) goto LAB_00ef8077;
          *puVar6 = 0;
        }
        if ((matcher->groupInfos).ptr[(int)uVar8].length != 0xffffffff) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar6 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                             ,0xbf5,"(matcher.GroupIdToGroupInfo(i)->IsUndefined())",
                             "matcher.GroupIdToGroupInfo(i)->IsUndefined()");
          if (!bVar5) goto LAB_00ef8077;
          *puVar6 = 0;
        }
        uVar8 = uVar8 + 1;
      } while ((int)uVar8 <= (this->super_BodyGroupsMixin).maxBodyGroupId);
    }
    pLVar3[iVar2].number = 0;
    *instPointer = *instPointer + 0x1d;
  }
  else {
    if ((this->super_BeginLoopMixin).super_BeginLoopBasicsMixin.repeats.lower != 0) {
      bVar5 = Matcher::Fail(matcher,input,inputOffset,instPointer,contStack,assertionStack,qcTicks);
      return bVar5;
    }
    uVar8 = (this->super_BeginLoopMixin).exitLabel;
    pPVar7 = (matcher->program).ptr;
    if ((pPVar7->rep).insts.instsLen <= uVar8) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                         ,0x76d,"(label < program->rep.insts.instsLen)",
                         "label < program->rep.insts.instsLen");
      if (!bVar5) goto LAB_00ef8077;
      *puVar6 = 0;
      pPVar7 = (matcher->program).ptr;
    }
    *instPointer = (pPVar7->rep).insts.insts.ptr + uVar8;
  }
  return false;
}

Assistant:

inline bool BeginLoopIfCharInst::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
#if ENABLE_REGEX_CONFIG_OPTIONS
        matcher.CompStats();
#endif
        if (inputOffset < inputLength && input[inputOffset] == c)
        {
            // Commit to at least one iteration of loop
            LoopInfo* loopInfo = matcher.LoopIdToLoopInfo(loopId);

            // All inner groups must begin reset
#if DBG
            for (int i = minBodyGroupId; i <= maxBodyGroupId; i++)
            {
                Assert(matcher.GroupIdToGroupInfo(i)->IsUndefined());
            }
#endif
            loopInfo->number = 0;
            instPointer += sizeof(*this);
            return false;
        }

        if (repeats.lower > 0)
        {
            return matcher.Fail(FAIL_PARAMETERS);
        }

        instPointer = matcher.LabelToInstPointer(exitLabel);
        return false;
    }